

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O0

void __thiscall
Secp256k1_RangeProofInfoSecp256k1ErrorTest_Test::TestBody
          (Secp256k1_RangeProofInfoSecp256k1ErrorTest_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  CfdException *cfd_exception_1;
  Message local_160 [2];
  CfdException *anon_var_0_1;
  char *pcStack_148;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  string local_138;
  undefined1 local_118 [8];
  ByteData range_proof_1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CfdException *cfd_exception;
  Message local_a8 [2];
  CfdException *anon_var_0;
  char *pcStack_90;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  ByteData range_proof;
  uint64_t max_value;
  uint64_t min_value;
  int mantissa;
  int exponent;
  Secp256k1 secp;
  secp256k1_context_struct *ctx;
  Secp256k1_RangeProofInfoSecp256k1ErrorTest_Test *this_local;
  
  secp.secp256k1_context_ = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1((Secp256k1 *)&mantissa,secp.secp256k1_context_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  cfd::core::ByteData::ByteData((ByteData *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff70,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff70);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Secp256k1::RangeProofInfoSecp256k1
                ((Secp256k1 *)&mantissa,(ByteData *)local_50,(int *)((long)&min_value + 4),
                 (int *)&min_value,&max_value,
                 (uint64_t *)
                 &range_proof.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_90 = 
      "Expected: secp.RangeProofInfoSecp256k1(range_proof, &exponent, &mantissa, &min_value, &max_value) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_004c7c84;
    }
  }
  else {
LAB_004c7c84:
    testing::Message::Message(local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cfd_exception,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
               ,0x1bd,pcStack_90);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cfd_exception,local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cfd_exception);
    testing::Message::~Message(local_a8);
  }
  cfd::core::ByteData::~ByteData((ByteData *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,"0000",(allocator *)((long)&gtest_msg_1.value + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffeb8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffeb8);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Secp256k1::RangeProofInfoSecp256k1
                ((Secp256k1 *)&mantissa,(ByteData *)local_118,(int *)((long)&min_value + 4),
                 (int *)&min_value,&max_value,
                 (uint64_t *)
                 &range_proof.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    if ((anon_var_0_1._7_1_ & 1) != 0) goto LAB_004c82d8;
    pcStack_148 = 
    "Expected: secp.RangeProofInfoSecp256k1(range_proof, &exponent, &mantissa, &min_value, &max_value) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_160);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&cfd_exception_1,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
             ,0x1c8,pcStack_148);
  testing::internal::AssertHelper::operator=((AssertHelper *)&cfd_exception_1,local_160);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cfd_exception_1);
  testing::Message::~Message(local_160);
LAB_004c82d8:
  cfd::core::ByteData::~ByteData((ByteData *)local_118);
  return;
}

Assistant:

TEST(Secp256k1, RangeProofInfoSecp256k1ErrorTest) {
  struct secp256k1_context_struct *ctx = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(ctx);

  int exponent;
  int mantissa;
  uint64_t min_value;
  uint64_t max_value;
  // empty range_proof
  {
    ByteData range_proof("");
    try {
      EXPECT_THROW(secp.RangeProofInfoSecp256k1(range_proof, &exponent, &mantissa, &min_value, &max_value), CfdException);
    } catch (const CfdException &cfd_exception) {
      EXPECT_EQ(cfd_exception.GetErrorCode(), CfdError::kCfdIllegalArgumentError);
      EXPECT_STREQ(cfd_exception.what(), "Secp256k1 empty range proof Error.");
    }
  }

  // invalid range_proof
  {
    ByteData range_proof("0000");
    try {
      EXPECT_THROW(secp.RangeProofInfoSecp256k1(range_proof, &exponent, &mantissa, &min_value, &max_value), CfdException);
    } catch (const CfdException &cfd_exception) {
      EXPECT_EQ(cfd_exception.GetErrorCode(), CfdError::kCfdIllegalArgumentError);
      EXPECT_STREQ(cfd_exception.what(), "Secp256k1 empty range proof Error.");
    }
  }
}